

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchclient.hpp
# Opt level: O3

BatchRequest * __thiscall
jsonrpccxx::BatchRequest::AddMethodCall
          (BatchRequest *this,id_type *id,string *name,positional_parameter *params)

{
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *s;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *this_00;
  variant_alternative_t<0UL,_variant<int,_basic_string<char>_>_> *pvVar1;
  long lVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *j;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  json request;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  bStack_138;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_128;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_118;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_100;
  undefined8 local_f0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_e8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d0;
  undefined8 local_c0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_a0;
  undefined8 local_90;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_78;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_60;
  undefined8 local_50;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  undefined8 local_38;
  
  local_b8.owned_value.m_type = null;
  local_b8.owned_value.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[7],_0>
            (&local_b8.owned_value,(char (*) [7])0x17dc15);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_b8.owned_value,true);
  local_b8.value_ref = (value_type *)0x0;
  local_a0.m_type = null;
  local_a0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_a0,name);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_a0,true);
  local_90 = 0;
  init._M_len = 2;
  init._M_array = &local_b8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_78.owned_value,init,true,array);
  local_78.value_ref = (value_type *)0x0;
  local_e8.owned_value.m_type = null;
  local_e8.owned_value.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[7],_0>
            (&local_e8.owned_value,(char (*) [7])0x17a7ee);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_e8.owned_value,true);
  local_e8.value_ref = (value_type *)0x0;
  local_d0.m_type = null;
  local_d0.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)2>::
  construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (&local_d0,params);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_d0,true);
  local_c0 = 0;
  init_00._M_len = 2;
  init_00._M_array = &local_e8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_60,init_00,true,array);
  local_50 = 0;
  local_118.owned_value.m_type = null;
  local_118.owned_value.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[8],_0>
            (&local_118.owned_value,(char (*) [8])"jsonrpc");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_118.owned_value,true);
  local_118.value_ref = (value_type *)0x0;
  local_100.m_type = null;
  local_100.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[4],_0>
            (&local_100,(char (*) [4])"2.0");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_100,true);
  local_f0 = 0;
  init_01._M_len = 2;
  init_01._M_array = &local_118;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&local_48,init_01,true,array);
  local_38 = 0;
  init_02._M_len = 3;
  init_02._M_array = &local_78;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&bStack_138,init_02,true,array);
  lVar2 = 0x30;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_78.owned_value.m_type + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x18;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_118.owned_value.m_type + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x18;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_e8.owned_value.m_type + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  lVar2 = 0x18;
  do {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)(&local_b8.owned_value.m_type + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  if ((id->
      super__Variant_base<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super__Move_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_assign_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Move_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Copy_ctor_alias<int,_std::__cxx11::basic_string<char>_>.
      super__Variant_storage_alias<int,_std::__cxx11::basic_string<char>_>._M_index == '\0') {
    pvVar1 = std::get<0ul,int,std::__cxx11::string>(id);
    j = &local_88;
    local_88.m_type = null;
    local_88.m_value.object = (object_t *)0x0;
    nlohmann::detail::external_constructor<(nlohmann::detail::value_t)5>::
    construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (j,(long)*pvVar1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(j,true);
    this_00 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)&bStack_138,"id");
  }
  else {
    s = std::get<1ul,int,std::__cxx11::string>(id);
    local_128.m_type = null;
    local_128.m_value.object = (object_t *)0x0;
    nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
    construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_128,s);
    j = &local_128;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant(j,true);
    this_00 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)&bStack_138,"id");
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(this_00,j);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(j);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::push_back(&this->call,&bStack_138);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&bStack_138);
  return this;
}

Assistant:

BatchRequest &AddMethodCall(const id_type &id, const std::string &name, const positional_parameter &params = {}) {
      json request = {{"method", name}, {"params", params}, {"jsonrpc", "2.0"}};
      if (std::get_if<int>(&id) != nullptr) {
        request["id"] = std::get<int>(id);
      } else {
        request["id"] = std::get<std::string>(id);
      }
      call.push_back(request);
      return *this;
    }